

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

CEPlanet * CEPlanet::EMBarycenter(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"EMBaryCenter",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,1.00000018,-3e-08);
  SetEccentricity(in_RDI,0.01673163,-3.661e-05);
  SetInclination(in_RDI,-0.00054346,-0.01337178,DEGREES);
  SetMeanLongitude(in_RDI,100.46691572,35999.37306329,DEGREES);
  SetPerihelionLongitude(in_RDI,102.93005885,0.3179526,DEGREES);
  SetAscendingNodeLongitude(in_RDI,-5.11260389,-0.24123856,DEGREES);
  local_40._M_dataplus._M_p = (pointer)0x4008000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::EMBarycenter()
{
    CEPlanet em_barycenter("EMBaryCenter", 0.0, 0.0) ;
    em_barycenter.SetSemiMajorAxis_AU(1.00000018, -0.00000003) ;
    em_barycenter.SetEccentricity(0.01673163, -0.00003661) ;
    em_barycenter.SetInclination(-0.00054346, -0.01337178, CEAngleType::DEGREES) ;
    em_barycenter.SetMeanLongitude(100.46691572, 35999.37306329, CEAngleType::DEGREES) ;
    em_barycenter.SetPerihelionLongitude(102.93005885, 0.31795260, CEAngleType::DEGREES) ;
    em_barycenter.SetAscendingNodeLongitude(-5.11260389, -0.24123856, CEAngleType::DEGREES) ;

    // Set the sofa planet ID
    em_barycenter.SetSofaID(3) ;
    
    return em_barycenter ;
}